

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

_Bool ftp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *code)

{
  int iVar1;
  curl_off_t status;
  int local_18 [2];
  char *local_10;
  
  if ((((3 < len) && ((byte)(*line - 0x30U) < 10)) && ((byte)(line[1] - 0x30U) < 10)) &&
     ((((byte)(line[2] - 0x30U) < 10 && (line[3] == ' ')) &&
      (local_10 = line, iVar1 = Curl_str_number(&local_10,(curl_off_t *)local_18,999), iVar1 == 0)))
     ) {
    *code = local_18[0];
    return true;
  }
  return false;
}

Assistant:

static bool ftp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                          const char *line, size_t len, int *code)
{
  curl_off_t status;
  (void)data;
  (void)conn;

  if((len > 3) && LASTLINE(line) && !Curl_str_number(&line, &status, 999)) {
    *code = (int)status;
    return TRUE;
  }

  return FALSE;
}